

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O0

deUint32 __thiscall
deqp::egl::anon_unknown_3::MutableRenderBufferTest::drawAndSwap
          (MutableRenderBufferTest *this,Library *egl,deUint32 color,bool flush)

{
  deUint32 err;
  deBool dVar1;
  float fVar2;
  bool flush_local;
  deUint32 color_local;
  Library *egl_local;
  MutableRenderBufferTest *this_local;
  
  fVar2 = (float)color / 255.0;
  (*(this->m_gl).clearColor)(fVar2,fVar2,fVar2,(float)color / 255.0);
  (*(this->m_gl).clear)(0x4000);
  if (flush) {
    (*(this->m_gl).flush)();
  }
  else {
    do {
      (*egl->_vptr_Library[0x31])(egl,this->m_eglDisplay,this->m_eglSurface);
      err = (*egl->_vptr_Library[0x1f])();
      eglu::checkError(err,"swapBuffers(m_eglDisplay, m_eglSurface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                       ,0xd5);
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
  }
  return color | color << 8 | color << 0x10 | color << 0x18;
}

Assistant:

deUint32 MutableRenderBufferTest::drawAndSwap (const Library& egl, deUint32 color, bool flush)
{
	DE_ASSERT(color < 256);
	m_gl.clearColor((float)color/255.f, (float)color/255.f, (float)color/255.f, (float)color/255.f);
	m_gl.clear(GL_COLOR_BUFFER_BIT);
	if (flush)
	{
		m_gl.flush();
	}
	else
	{
		EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));
	}
	return (color | color << 8 | color << 16 | color << 24);
}